

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::isa_2b_to_sa(suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
               *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1)

{
  value_type vVar1;
  size_type sVar2;
  MPI_Comm comm;
  reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  unsigned_long uVar6;
  allocator local_129;
  string local_128 [32];
  ulong local_108;
  size_t i_1;
  string local_f8 [32];
  TwoBSA<unsigned_long> *local_d8;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_d0;
  allocator local_c1;
  string local_c0 [32];
  ulong local_a0;
  size_t i;
  size_t str_offset;
  allocator<TwoBSA<unsigned_long>_> local_79;
  undefined1 local_78 [8];
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> tuple_vec;
  section_timer timer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_B2_local;
  suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *this_local;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(param_1);
  if (sVar2 != this->local_size) {
    __assert_fail("local_B2.size() == local_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x339,
                  "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::isa_2b_to_sa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                 );
  }
  comm = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                     &tuple_vec.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cerr,comm,
                     0);
  sVar2 = this->local_size;
  std::allocator<TwoBSA<unsigned_long>_>::allocator(&local_79);
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_78,
             sVar2,&local_79);
  std::allocator<TwoBSA<unsigned_long>_>::~allocator(&local_79);
  i = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size(&this->part);
  local_a0 = 0;
  while( true ) {
    if (this->local_size <= local_a0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->local_B);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit(&this->local_B);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(param_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit(param_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->local_SA);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit(&this->local_SA);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"isa2sa_tupleize",&local_c1);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &tuple_vec.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      local_d0._M_current =
           (TwoBSA<unsigned_long> *)
           std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                     ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                      local_78);
      local_d8 = (TwoBSA<unsigned_long> *)
                 std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                           ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_78);
      mxx::
      sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                (local_d0,(__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                           )local_d8,&this->comm);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"isa2sa_samplesort",(allocator *)((long)&i_1 + 7));
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &tuple_vec.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->local_B,this->local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(param_1,this->local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->local_SA,this->local_size);
      for (local_108 = 0; local_108 < this->local_size; local_108 = local_108 + 1) {
        pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_78,local_108);
        uVar6 = pvVar4->B1;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_B,local_108);
        *pvVar3 = uVar6;
        pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_78,local_108);
        uVar6 = pvVar4->B2;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_1,local_108);
        *pvVar3 = uVar6;
        pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_78,local_108);
        uVar6 = pvVar4->SA;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_SA,local_108);
        *pvVar3 = uVar6;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"isa2sa_untupleize",&local_129);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &tuple_vec.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_128);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_78)
      ;
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
      ~section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>
                           *)&tuple_vec.
                              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,local_a0);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        local_78,local_a0);
    pvVar4->B1 = vVar1;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (param_1,local_a0);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        local_78,local_a0);
    pvVar4->B2 = vVar1;
    uVar5 = i + local_a0;
    uVar6 = std::numeric_limits<unsigned_long>::max();
    if (uVar6 <= uVar5) break;
    uVar6 = i + local_a0;
    pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        local_78,local_a0);
    pvVar4->SA = uVar6;
    local_a0 = local_a0 + 1;
  }
  __assert_fail("str_offset + i < std::numeric_limits<index_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                ,0x349,
                "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::isa_2b_to_sa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
               );
}

Assistant:

void isa_2b_to_sa(std::vector<index_t>& local_B2) {
    assert(local_B2.size() == local_size);
    SAC_TIMER_START();

    // convert the struct of arrays (local_SA, local_B, etc) into
    // array of structs (TwoBSA {.B1, .B2, .SA}) for sorting purposes

    // initialize tuple array
    std::vector<TwoBSA<index_t> > tuple_vec(local_size);

    // get global index offset
    std::size_t str_offset = part.excl_prefix_size();

    // fill tuple vector
    for (std::size_t i = 0; i < local_size; ++i) {
        tuple_vec[i].B1 = local_B[i];
        tuple_vec[i].B2 = local_B2[i];
        assert(str_offset + i < std::numeric_limits<index_t>::max());
        tuple_vec[i].SA = str_offset + i;
    }

    // release memory of input (to remain at the minimum 6x words memory usage)
    local_B.clear(); local_B.shrink_to_fit();
    local_B2.clear(); local_B2.shrink_to_fit();
    local_SA.clear(); local_SA.shrink_to_fit();

    SAC_TIMER_END_SECTION("isa2sa_tupleize");

    // parallel, distributed sample-sorting of tuples (B1, B2, SA)
    mxx::sort(tuple_vec.begin(), tuple_vec.end(), comm);

    SAC_TIMER_END_SECTION("isa2sa_samplesort");

    // reallocate output
    local_B.resize(local_size);
    local_B2.resize(local_size);
    local_SA.resize(local_size);

    // back convert array of structs into struct of arrays

    // read back into input vectors
    for (std::size_t i = 0; i < local_size; ++i) {
        local_B[i] = tuple_vec[i].B1;
        local_B2[i] = tuple_vec[i].B2;
        local_SA[i] = tuple_vec[i].SA;
    }
    SAC_TIMER_END_SECTION("isa2sa_untupleize");
}